

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::IsFunctionBlocked(cmMakefile *this,cmListFileFunction *lff,cmExecutionStatus *status)

{
  bool bVar1;
  uint uVar2;
  reference ppcVar3;
  undefined1 local_50 [16];
  reverse_iterator<__gnu_cxx::__normal_iterator<cmFunctionBlocker_**,_std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>_>_>
  local_40;
  reverse_iterator pos;
  __normal_iterator<cmFunctionBlocker_**,_std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>_>
  local_30;
  cmExecutionStatus *local_28;
  cmExecutionStatus *status_local;
  cmListFileFunction *lff_local;
  cmMakefile *this_local;
  
  local_28 = status;
  status_local = (cmExecutionStatus *)lff;
  lff_local = (cmListFileFunction *)this;
  local_30._M_current =
       (cmFunctionBlocker **)
       std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::begin
                 (&this->FunctionBlockers);
  pos.current._M_current =
       std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::end
                 (&this->FunctionBlockers);
  bVar1 = __gnu_cxx::operator==(&local_30,&pos.current);
  if (!bVar1) {
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<cmFunctionBlocker_**,_std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>_>_>
    ::reverse_iterator(&local_40);
    std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::rbegin
              ((vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_> *)(local_50 + 8));
    local_40.current._M_current =
         (__normal_iterator<cmFunctionBlocker_**,_std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>_>
          )(__normal_iterator<cmFunctionBlocker_**,_std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>_>
            )local_50._8_8_;
    while( true ) {
      std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::rend
                ((vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_> *)local_50);
      bVar1 = std::operator!=(&local_40,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<cmFunctionBlocker_**,_std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>_>_>
                               *)local_50);
      if (!bVar1) break;
      ppcVar3 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<cmFunctionBlocker_**,_std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>_>_>
                ::operator*(&local_40);
      uVar2 = (**(*ppcVar3)->_vptr_cmFunctionBlocker)(*ppcVar3,status_local,this,local_28);
      if ((uVar2 & 1) != 0) {
        return true;
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<cmFunctionBlocker_**,_std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>_>_>
      ::operator++(&local_40);
    }
  }
  return false;
}

Assistant:

bool cmMakefile::IsFunctionBlocked(const cmListFileFunction& lff,
                                   cmExecutionStatus& status)
{
  // if there are no blockers get out of here
  if (this->FunctionBlockers.begin() == this->FunctionBlockers.end()) {
    return false;
  }

  // loop over all function blockers to see if any block this command
  // evaluate in reverse, this is critical for balanced IF statements etc
  std::vector<cmFunctionBlocker*>::reverse_iterator pos;
  for (pos = this->FunctionBlockers.rbegin();
       pos != this->FunctionBlockers.rend(); ++pos) {
    if ((*pos)->IsFunctionBlocked(lff, *this, status)) {
      return true;
    }
  }

  return false;
}